

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_input_attachment_aspect
          (Impl *this,Value *state,VkRenderPassInputAttachmentAspectCreateInfo **out_info)

{
  SizeType SVar1;
  uint uVar2;
  VkRenderPassInputAttachmentAspectCreateInfo *pVVar3;
  Type pGVar4;
  VkInputAttachmentAspectReference *pVVar5;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar6;
  Type pGVar7;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *aspect;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkRenderPassInputAttachmentAspectCreateInfo>
                     (&this->allocator);
  *out_info = pVVar3;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"aspectReferences");
  SVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(pGVar4);
  pVVar3->aspectReferenceCount = SVar1;
  pVVar5 = ScratchAllocator::allocate_n_cleared<VkInputAttachmentAspectReference>
                     (&this->allocator,(ulong)SVar1);
  pVVar3->pAspectReferences = pVVar5;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"aspectReferences");
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::Begin(pGVar4);
  while( true ) {
    pGVar6 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::End(pGVar4);
    if (this_00 == pGVar6) break;
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_00,"subpass");
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar7);
    pVVar5->subpass = uVar2;
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_00,"inputAttachmentIndex");
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar7);
    pVVar5->inputAttachmentIndex = uVar2;
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_00,"aspectMask");
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar7);
    pVVar5->aspectMask = uVar2;
    this_00 = this_00 + 0x10;
    pVVar5 = pVVar5 + 1;
  }
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_input_attachment_aspect(const Value &state,
						        VkRenderPassInputAttachmentAspectCreateInfo **out_info)
{
	auto *info = allocator.allocate_cleared<VkRenderPassInputAttachmentAspectCreateInfo>();
	*out_info = info;

	info->aspectReferenceCount = state["aspectReferences"].Size();

	auto *new_aspects = allocator.allocate_n_cleared<VkInputAttachmentAspectReference>(info->aspectReferenceCount);
	info->pAspectReferences = new_aspects;

	auto &aspects = state["aspectReferences"];
	for (auto aspect_itr = aspects.Begin(); aspect_itr != aspects.End(); ++aspect_itr, new_aspects++)
	{
		auto &aspect = *aspect_itr;
		new_aspects->subpass = aspect["subpass"].GetUint();
		new_aspects->inputAttachmentIndex = aspect["inputAttachmentIndex"].GetUint();
		new_aspects->aspectMask = static_cast<VkImageAspectFlags>(aspect["aspectMask"].GetUint());
	}

	*out_info = info;
	return true;
}